

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PsxRelocator.cpp
# Opt level: O2

bool __thiscall
PsxRelocator::relocateFile(PsxRelocator *this,PsxRelocatorFile *file,int *relocationAddress)

{
  pointer pPVar1;
  size_t sVar2;
  PsxSymbol *pPVar3;
  element_type *peVar4;
  pointer pPVar5;
  pointer pPVar6;
  RelocationAction *action;
  long lVar7;
  mapped_type_conflict1 *pmVar8;
  pointer pRVar9;
  uint uVar10;
  PsxRelocatorFile *in_RCX;
  PsxSegment *seg;
  pointer pPVar11;
  long lVar12;
  pointer pPVar13;
  bool bVar14;
  pointer pbVar15;
  PsxRelocation *rel;
  int *__k;
  pointer pPVar16;
  string *error;
  pointer pbVar17;
  int iVar18;
  string_view text;
  string_view text_00;
  vector<RelocationAction,_std::allocator<RelocationAction>_> relocationActions;
  ByteArray sectionData;
  int index;
  undefined4 uStack_e4;
  pointer pPStack_e0;
  pointer local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  errors_1;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> relocationOffsets;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> symbolOffsets;
  
  relocationOffsets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &relocationOffsets._M_t._M_impl.super__Rb_tree_header._M_header;
  relocationOffsets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  relocationOffsets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  relocationOffsets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  symbolOffsets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &symbolOffsets._M_t._M_impl.super__Rb_tree_header._M_header;
  symbolOffsets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  symbolOffsets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  symbolOffsets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar18 = *relocationAddress;
  lVar7 = (long)iVar18;
  pPVar1 = (file->segments).super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>._M_impl.
           super__Vector_impl_data._M_finish;
  relocationOffsets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       relocationOffsets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  symbolOffsets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       symbolOffsets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (pPVar11 = (file->segments).super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>.
                 _M_impl.super__Vector_impl_data._M_start; pPVar11 != pPVar1; pPVar11 = pPVar11 + 1)
  {
    _index = (pointer)CONCAT44(uStack_e4,pPVar11->id);
    sVar2 = (pPVar11->data).size_;
    pmVar8 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[](&relocationOffsets,&index);
    *pmVar8 = iVar18;
    iVar18 = (int)sVar2 + *relocationAddress;
    iVar18 = (-iVar18 & 3U) + iVar18;
    *relocationAddress = iVar18;
  }
  pPVar3 = (file->symbols).super__Vector_base<PsxSymbol,_std::allocator<PsxSymbol>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __k = &((file->symbols).super__Vector_base<PsxSymbol,_std::allocator<PsxSymbol>_>._M_impl.
          super__Vector_impl_data._M_start)->segment;
  bVar14 = false;
  do {
    if ((PsxSymbol *)(__k + -10) == pPVar3) {
      if (bVar14) {
        bVar14 = false;
      }
      else {
        sVar2 = (this->outputData).size_;
        ByteArray::reserveBytes(&this->outputData,*relocationAddress - lVar7,'\0');
        pPVar1 = (file->segments).super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pPVar11 = (file->segments).super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>.
                       _M_impl.super__Vector_impl_data._M_start; pPVar11 != pPVar1;
            pPVar11 = pPVar11 + 1) {
          ByteArray::ByteArray(&sectionData,&pPVar11->data);
          relocationActions.super__Vector_base<RelocationAction,_std::allocator<RelocationAction>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          relocationActions.super__Vector_base<RelocationAction,_std::allocator<RelocationAction>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          relocationActions.super__Vector_base<RelocationAction,_std::allocator<RelocationAction>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          pPVar5 = (pPVar11->relocations).
                   super__Vector_base<PsxRelocation,_std::allocator<PsxRelocation>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (pPVar16 = (pPVar11->relocations).
                         super__Vector_base<PsxRelocation,_std::allocator<PsxRelocation>_>._M_impl.
                         super__Vector_impl_data._M_start; pPVar16 != pPVar5; pPVar16 = pPVar16 + 1)
          {
            _index = (pointer)(long)pPVar16->segmentOffset;
            iVar18 = ByteArray::getDoubleWord(&sectionData,(size_t)_index,Little);
            local_d8 = (pointer)CONCAT44(local_d8._4_4_,iVar18);
            if (pPVar16->refType == SymblId) {
              pmVar8 = std::
                       map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                       operator[](&symbolOffsets,&pPVar16->referenceId);
              uVar10 = pPVar16->relativeOffset + *pmVar8;
LAB_0015d358:
              in_RCX = (PsxRelocatorFile *)(ulong)uVar10;
              pPStack_e0 = (pointer)(long)(int)uVar10;
            }
            else if (pPVar16->refType == SegmentOffset) {
              pmVar8 = std::
                       map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                       operator[](&relocationOffsets,&pPVar16->referenceId);
              uVar10 = pPVar16->referencePos + *pmVar8 + pPVar16->relativeOffset;
              goto LAB_0015d358;
            }
            errors_1.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            errors_1.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            errors_1.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            if ((ulong)pPVar16->type < 4) {
              in_RCX = (PsxRelocatorFile *)&relocationActions;
              iVar18 = (*(this->reloc->super_IElfRelocator)._vptr_IElfRelocator[4])
                                 (this->reloc,
                                  (ulong)*(uint *)(&DAT_0017e020 + (ulong)pPVar16->type * 4),&index,
                                  in_RCX,&errors_1);
              pbVar15 = errors_1.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              pbVar17 = errors_1.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if ((char)iVar18 == '\0') goto LAB_0015d3d4;
            }
            else {
              pbVar15 = (pointer)0x0;
              pbVar17 = (pointer)0x0;
LAB_0015d3d4:
              for (; pbVar17 != pbVar15; pbVar17 = pbVar17 + 1) {
                text._M_str = (char *)in_RCX;
                text._M_len = (size_t)(pbVar17->_M_dataplus)._M_p;
                Logger::queueError((Logger *)0x1,(ErrorType)pbVar17->_M_string_length,text);
              }
              bVar14 = true;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&errors_1);
          }
          local_d8 = (pointer)0x0;
          _index = (pointer)0x0;
          pPStack_e0 = (pointer)0x0;
          iVar18 = (*(this->reloc->super_IElfRelocator)._vptr_IElfRelocator[5])
                             (this->reloc,&relocationActions,&index);
          pPVar6 = pPStack_e0;
          pRVar9 = relocationActions.
                   super__Vector_base<RelocationAction,_std::allocator<RelocationAction>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pPVar13 = _index;
          if ((char)iVar18 == '\0') {
            for (; pPVar13 != pPVar6; pPVar13 = (pointer)&pPVar13->id) {
              text_00._M_str = (char *)in_RCX;
              text_00._M_len = (size_t)(pPVar13->name)._M_dataplus._M_p;
              Logger::queueError((Logger *)0x1,(ErrorType)(pPVar13->name)._M_string_length,text_00);
            }
            bVar14 = true;
            pRVar9 = relocationActions.
                     super__Vector_base<RelocationAction,_std::allocator<RelocationAction>_>._M_impl
                     .super__Vector_impl_data._M_start;
          }
          for (; pRVar9 != relocationActions.
                           super__Vector_base<RelocationAction,_std::allocator<RelocationAction>_>.
                           _M_impl.super__Vector_impl_data._M_finish; pRVar9 = pRVar9 + 1) {
            if (pRVar9->offset + 3U < sectionData.size_) {
              *(uint32_t *)(sectionData.data_ + pRVar9->offset) = pRVar9->newValue;
            }
          }
          pmVar8 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                   operator[](&relocationOffsets,&pPVar11->id);
          in_RCX = (PsxRelocatorFile *)this;
          memcpy((this->outputData).data_ + (long)*pmVar8 + (sVar2 - lVar7),sectionData.data_,
                 sectionData.size_);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&index);
          std::_Vector_base<RelocationAction,_std::allocator<RelocationAction>_>::~_Vector_base
                    (&relocationActions.
                      super__Vector_base<RelocationAction,_std::allocator<RelocationAction>_>);
          ByteArray::~ByteArray(&sectionData);
        }
        bVar14 = (bool)(bVar14 ^ 1);
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&symbolOffsets._M_t);
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&relocationOffsets._M_t);
      return bVar14;
    }
    switch(((PsxSymbol *)(__k + -10))->type) {
    case Internal:
    case Function:
      peVar4 = (((shared_ptr<Label> *)(__k + 4))->
               super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      pmVar8 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[](&relocationOffsets,__k);
      in_RCX = (PsxRelocatorFile *)((long)__k[1] + (long)*pmVar8);
      peVar4->value = (int64_t)in_RCX;
      ((((shared_ptr<Label> *)(__k + 4))->super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr)->defined = true;
      break;
    case InternalID:
      pmVar8 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[](&relocationOffsets,__k);
      lVar12 = (long)__k[1] + (long)*pmVar8;
      peVar4 = (((shared_ptr<Label> *)(__k + 4))->
               super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      peVar4->value = lVar12;
      peVar4->defined = true;
      pmVar8 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[](&symbolOffsets,__k + 2);
LAB_0015d237:
      *pmVar8 = (mapped_type_conflict1)lVar12;
      break;
    case External:
      peVar4 = (((shared_ptr<Label> *)(__k + 4))->
               super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (peVar4->defined != false) {
        lVar12 = peVar4->value;
        pmVar8 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[](&symbolOffsets,__k + 2);
        goto LAB_0015d237;
      }
      bVar14 = true;
      in_RCX = file;
      Logger::queueError<std::__cxx11::string,std::__cxx11::string>
                (Error,"Undefined external symbol %s in file %s",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(__k + -8),
                 &file->name);
      break;
    case BSS:
      peVar4 = (((shared_ptr<Label> *)(__k + 4))->
               super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      iVar18 = *relocationAddress;
      peVar4->value = (long)iVar18;
      peVar4->defined = true;
      pmVar8 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[](&symbolOffsets,__k + 2);
      *pmVar8 = iVar18;
      uVar10 = (-(*relocationAddress + __k[3]) & 3U) + *relocationAddress + __k[3];
      in_RCX = (PsxRelocatorFile *)(ulong)uVar10;
      *relocationAddress = uVar10;
    }
    __k = __k + 0x12;
  } while( true );
}

Assistant:

bool PsxRelocator::relocateFile(PsxRelocatorFile& file, int& relocationAddress)
{
	std::map<int,int> relocationOffsets;
	std::map<int,int> symbolOffsets;
	int start = relocationAddress;

	// assign addresses to segments
	for (PsxSegment& seg: file.segments)
	{
		int index = seg.id;
		size_t size = seg.data.size();
		
		relocationOffsets[index] = relocationAddress;
		relocationAddress += (int) size;

		while (relocationAddress % 4)
			relocationAddress++;
	}
	
	// parse/add/relocate symbols
	bool error = false;
	for (PsxSymbol& sym: file.symbols)
	{
		int pos;
		switch (sym.type)
		{
		case PsxSymbolType::Internal:
		case PsxSymbolType::Function:
			sym.label->setValue(relocationOffsets[sym.segment]+sym.offset);
			sym.label->setDefined(true);
			break;
		case PsxSymbolType::InternalID:
			pos = relocationOffsets[sym.segment]+sym.offset;
			sym.label->setValue(pos);
			sym.label->setDefined(true);
			symbolOffsets[sym.id] = pos;
			break;
		case PsxSymbolType::BSS:
			sym.label->setValue(relocationAddress);
			sym.label->setDefined(true);
			symbolOffsets[sym.id] = relocationAddress;
			relocationAddress += sym.size;
			
			while (relocationAddress % 4)
				relocationAddress++;
			break;
		case PsxSymbolType::External:
			if (!sym.label->isDefined())
			{
				Logger::queueError(Logger::Error, "Undefined external symbol %s in file %s",sym.name,file.name);
				error = true;
				continue;
			}
			
			symbolOffsets[sym.id] = (int) sym.label->getValue();
			break;
		}
	}

	if (error)
		return false;

	size_t dataStart = outputData.size();
	outputData.reserveBytes(relocationAddress-start);

	// load code and data
	for (PsxSegment& seg: file.segments)
	{
		// relocate
		ByteArray sectionData = seg.data;

		std::vector<RelocationAction> relocationActions;
		for (PsxRelocation& rel: seg.relocations)
		{
			RelocationData relData;
			int pos = rel.segmentOffset;
			relData.opcodeOffset = pos;
			relData.opcode = sectionData.getDoubleWord(pos);

			switch (rel.refType)
			{
			case PsxRelocationRefType::SymblId:
				relData.relocationBase = symbolOffsets[rel.referenceId]+rel.relativeOffset;
				break;
			case PsxRelocationRefType::SegmentOffset:
				relData.relocationBase = relocationOffsets[rel.referenceId] + rel.referencePos+rel.relativeOffset;
				break;
			}

			std::vector<std::string> errors;
			bool result = false;

			switch (rel.type)
			{
			case PsxRelocationType::WordLiteral:
				result = reloc->relocateOpcode(R_MIPS_32,relData, relocationActions, errors);
				break;
			case PsxRelocationType::UpperImmediate:
				result = reloc->relocateOpcode(R_MIPS_HI16,relData, relocationActions, errors);
				break;
			case PsxRelocationType::LowerImmediate:
				result = reloc->relocateOpcode(R_MIPS_LO16,relData, relocationActions, errors);
				break;
			case PsxRelocationType::FunctionCall:
				result = reloc->relocateOpcode(R_MIPS_26,relData, relocationActions, errors);
				break;
			}

			if (!result)
			{
				for (const std::string& error : errors)
				{
					Logger::queueError(Logger::Error, error);
				}
				error = true;
			}
		}

		// finish any dangling relocations
		std::vector<std::string> errors;
		if (!reloc->finish(relocationActions, errors))
		{
			for (const std::string& error : errors)
			{
				Logger::queueError(Logger::Error, error);
			}
			error = true;
		}

		// now actually write the relocated values
		for (const RelocationAction& action : relocationActions)
		{
			sectionData.replaceDoubleWord(action.offset, action.newValue);
		}

		size_t arrayStart = dataStart+relocationOffsets[seg.id]-start;
		memcpy(outputData.data(arrayStart),sectionData.data(),sectionData.size());
	}

	return !error;
}